

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

_Bool parse_optional(gravity_parser_t *parser,gtoken_t token)

{
  gravity_lexer_t *lexer_00;
  _Bool _Var1;
  gtoken_t local_2c;
  gtoken_t peek;
  gravity_lexer_t *lexer;
  gtoken_t token_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  local_2c = gravity_lexer_peek(lexer_00);
  _Var1 = token_iserror(local_2c);
  if (_Var1) {
    parse_error(parser);
    local_2c = gravity_lexer_peek(lexer_00);
  }
  if (local_2c == token) {
    gravity_lexer_next(lexer_00);
  }
  return local_2c == token;
}

Assistant:

static bool parse_optional (gravity_parser_t *parser, gtoken_t token) {
    DECLARE_LEXER;

    gtoken_t peek = gravity_lexer_peek(lexer);
    if (token_iserror(peek)) {
        parse_error(parser);
        peek = gravity_lexer_peek(lexer);
    }

    if (peek == token) {
        gravity_lexer_next(lexer); // consume expected token
        return true;
    }

    // do not report any error in this case
    return false;
}